

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedResourcesMax::Run(AdvancedResourcesMax *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  bool *compile_error;
  long lVar2;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "\nlayout(local_size_x = 1) in;\nlayout(std140, binding = 0) buffer ShaderStorageBlock {\n  uint data;\n} g_shader_storage[8];\nlayout(std140, binding = 0) uniform UniformBlock {\n  uint data;\n} g_uniform[12];\nlayout(binding = 0) uniform usamplerBuffer g_sampler[16];\nlayout(binding = 0, r32ui) uniform uimageBuffer g_image[8];\nlayout(binding = 0, offset = 0) uniform atomic_uint g_atomic_counter0;\nlayout(binding = 1, offset = 0) uniform atomic_uint g_atomic_counter1;\nlayout(binding = 2, offset = 0) uniform atomic_uint g_atomic_counter2;\nlayout(binding = 3, offset = 0) uniform atomic_uint g_atomic_counter3;\nlayout(binding = 4, offset = 0) uniform atomic_uint g_atomic_counter4;\nlayout(binding = 5, offset = 0) uniform atomic_uint g_atomic_counter5;\nlayout(binding = 6, offset = 0) uniform atomic_uint g_atomic_counter6;\nlayout(binding = 7, offset = 0) uniform atomic_uint g_atomic_counter7;\nuniform uint g_uniform_def[480];\nuniform uint g_index = 0u;\n\nuint Add() {\n  switch (g_index) {\n    case 0: return atomicCounter(g_atomic_counter0);\n    case 1: return atomicCounter(g_atomic_counter1);\n    case 2: return atomicCounter(g_atomic_counter2);\n    case 3: return atomicCounter(g_atomic_counter3);\n    case 4: return atomicCounter(g_atomic_counter4);\n    case 5: return atomicCounter(g_atomic_counter5);\n    case 6: return atomicCounter(g_atomic_counter6);\n    case 7: return atomicCounter(g_atomic_counter7);\n  }\n}\nvoid main() {\n  g_shader_storage[g_index].data += g_uniform[g_index].data;\n  g_shader_storage[g_index].data += texelFetch(g_sampler[g_index], 0).x;\n  g_shader_storage[g_index].data += imageLoad(g_image[g_index], 0).x;\n  g_shader_storage[g_index].data += Add();\n  g_shader_storage[g_index].data += g_uniform_def[g_index];\n}"
             ,"");
  program = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_38);
  this->m_program = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar2 = -1;
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers(this_00,0x10,this->m_storage_buffer);
    glu::CallLogWrapper::glGenBuffers(this_00,0xc,this->m_uniform_buffer);
    glu::CallLogWrapper::glGenBuffers(this_00,8,this->m_atomic_buffer);
    glu::CallLogWrapper::glGenBuffers(this_00,0x10,this->m_texture_buffer);
    glu::CallLogWrapper::glGenTextures(this_00,0x10,this->m_texture);
    glu::CallLogWrapper::glGenBuffers(this_00,8,this->m_image_buffer);
    glu::CallLogWrapper::glGenTextures(this_00,8,this->m_image);
    bVar1 = RunIteration(this,0);
    if (bVar1) {
      bVar1 = RunIteration(this,1);
      if (bVar1) {
        bVar1 = RunIteration(this,5);
        lVar2 = (ulong)bVar1 - 1;
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 1) in;" NL "layout(std140, binding = 0) buffer ShaderStorageBlock {" NL
			   "  uint data;" NL "} g_shader_storage[8];" NL "layout(std140, binding = 0) uniform UniformBlock {" NL
			   "  uint data;" NL "} g_uniform[12];" NL "layout(binding = 0) uniform usamplerBuffer g_sampler[16];" NL
			   "layout(binding = 0, r32ui) uniform uimageBuffer g_image[8];" NL
			   "layout(binding = 0, offset = 0) uniform atomic_uint g_atomic_counter0;" NL
			   "layout(binding = 1, offset = 0) uniform atomic_uint g_atomic_counter1;" NL
			   "layout(binding = 2, offset = 0) uniform atomic_uint g_atomic_counter2;" NL
			   "layout(binding = 3, offset = 0) uniform atomic_uint g_atomic_counter3;" NL
			   "layout(binding = 4, offset = 0) uniform atomic_uint g_atomic_counter4;" NL
			   "layout(binding = 5, offset = 0) uniform atomic_uint g_atomic_counter5;" NL
			   "layout(binding = 6, offset = 0) uniform atomic_uint g_atomic_counter6;" NL
			   "layout(binding = 7, offset = 0) uniform atomic_uint g_atomic_counter7;" NL
			   "uniform uint g_uniform_def[480];" NL "uniform uint g_index = 0u;" NL NL "uint Add() {" NL
			   "  switch (g_index) {" NL "    case 0: return atomicCounter(g_atomic_counter0);" NL
			   "    case 1: return atomicCounter(g_atomic_counter1);" NL
			   "    case 2: return atomicCounter(g_atomic_counter2);" NL
			   "    case 3: return atomicCounter(g_atomic_counter3);" NL
			   "    case 4: return atomicCounter(g_atomic_counter4);" NL
			   "    case 5: return atomicCounter(g_atomic_counter5);" NL
			   "    case 6: return atomicCounter(g_atomic_counter6);" NL
			   "    case 7: return atomicCounter(g_atomic_counter7);" NL "  }" NL "}" NL "void main() {" NL
			   "  g_shader_storage[g_index].data += g_uniform[g_index].data;" NL
			   "  g_shader_storage[g_index].data += texelFetch(g_sampler[g_index], 0).x;" NL
			   "  g_shader_storage[g_index].data += imageLoad(g_image[g_index], 0).x;" NL
			   "  g_shader_storage[g_index].data += Add();" NL
			   "  g_shader_storage[g_index].data += g_uniform_def[g_index];" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(16, m_storage_buffer);
		glGenBuffers(12, m_uniform_buffer);
		glGenBuffers(8, m_atomic_buffer);
		glGenBuffers(16, m_texture_buffer);
		glGenTextures(16, m_texture);
		glGenBuffers(8, m_image_buffer);
		glGenTextures(8, m_image);

		if (!RunIteration(0))
			return ERROR;
		if (!RunIteration(1))
			return ERROR;
		if (!RunIteration(5))
			return ERROR;

		return NO_ERROR;
	}